

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RationalTangentialDistortion::RationalTangentialDistortion
          (RationalTangentialDistortion *this,Properties *prop,int id)

{
  Distortion *in_RDI;
  int in_stack_00000034;
  char *in_stack_00000038;
  char *in_stack_000000e8;
  double *in_stack_000000f0;
  char *in_stack_000000f8;
  Properties *in_stack_00000100;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__RationalTangentialDistortion_001f9a68;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_c8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_e8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_108);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000038,in_stack_00000034);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  std::__cxx11::string::~string(local_128);
  return;
}

Assistant:

RationalTangentialDistortion::RationalTangentialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");
  prop.getValue(getCameraKey("k4", id).c_str(), kd[5], "0");
  prop.getValue(getCameraKey("k5", id).c_str(), kd[6], "0");
  prop.getValue(getCameraKey("k6", id).c_str(), kd[7], "0");
}